

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
libcellml::Model::importRequirements_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,Model *this)

{
  pointer psVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  shared_ptr<libcellml::Component> *component;
  pointer psVar3;
  pointer psVar4;
  string url;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  importedUnits;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  importedComponents;
  ImportedEntity local_98;
  string local_88;
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  local_68;
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  local_48;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2> *)&local_68,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  local_88._M_dataplus._M_p =
       (pointer)local_68.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_88._M_string_length =
       (size_type)
       local_68.
       super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_68.
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  getImportedComponents(&local_48,(ComponentEntityConstPtr *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_68.
              super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Model,void>
            ((__shared_ptr<libcellml::Model_const,(__gnu_cxx::_Lock_policy)2> *)&local_88,
             (__weak_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2> *)
             &this->super_enable_shared_from_this<libcellml::Model>);
  getImportedUnits(&local_68,(ModelConstPtr *)&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length);
  for (psVar3 = local_48.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar1 = local_68.
               super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
      psVar3 != local_48.
                super__Vector_base<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar3 = psVar3 + 1) {
    ImportedEntity::importSource(&local_98);
    ImportSource::url_abi_cxx11_(&local_88,(ImportSource *)local_98._vptr_ImportedEntity);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.mPimpl);
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&local_88);
    if (_Var2._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  for (psVar4 = local_68.
                super__Vector_base<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar1; psVar4 = psVar4 + 1) {
    ImportedEntity::importSource(&local_98);
    ImportSource::url_abi_cxx11_(&local_88,(ImportSource *)local_98._vptr_ImportedEntity);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_98.mPimpl);
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (__return_storage_ptr__->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish,&local_88);
    if (_Var2._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(__return_storage_ptr__,&local_88);
    }
    std::__cxx11::string::~string((string *)&local_88);
  }
  std::
  vector<std::shared_ptr<libcellml::Units>,_std::allocator<std::shared_ptr<libcellml::Units>_>_>::
  ~vector(&local_68);
  std::
  vector<std::shared_ptr<libcellml::Component>,_std::allocator<std::shared_ptr<libcellml::Component>_>_>
  ::~vector(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> Model::importRequirements() const
{
    std::vector<std::string> requirements;

    auto importedComponents = getImportedComponents(shared_from_this());
    auto importedUnits = getImportedUnits(shared_from_this());

    for (auto &component : importedComponents) {
        auto url = component->importSource()->url();
        if (std::find(requirements.begin(), requirements.end(), url) == requirements.end()) {
            requirements.push_back(url);
        }
    }
    for (auto &units : importedUnits) {
        auto url = units->importSource()->url();
        if (std::find(requirements.begin(), requirements.end(), url) == requirements.end()) {
            requirements.push_back(url);
        }
    }

    return requirements;
}